

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask22_16(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  uVar1 = *(uint *)(this + 4);
  vpmovsxbd_avx(ZEXT416(0x3024180c));
  *in = uVar1 << 0x16 | *(uint *)this;
  uVar2 = *(uint *)(this + 8);
  in[1] = uVar2 << 0xc | uVar1 >> 10;
  uVar1 = *(uint *)(this + 0x3c);
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)(this + uVar1));
  auVar3 = vpsllvd_avx2(auVar6,_DAT_001901f0);
  vpmovsxbd_avx2(ZEXT816(0x38342c28201c1410));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar6 = vpmovsxbd_avx(ZEXT416(0x5030108));
  auVar8 = vpermi2d_avx512vl(ZEXT1632(auVar6),auVar7,ZEXT432(uVar2));
  auVar6 = vpsrlvd_avx2(auVar8._0_16_,_DAT_0019cbd0);
  auVar6 = vpor_avx(auVar3,auVar6);
  auVar8 = vpshufd_avx2(auVar7,0xa0);
  auVar5 = vpsrlvd_avx2(auVar8,_DAT_0019dae0);
  auVar4 = vpsllvd_avx2(auVar7,_DAT_0019db00);
  auVar8 = vpmovzxdq_avx2(auVar6);
  auVar8 = vpblendd_avx2(auVar8,auVar5,0xaa);
  auVar8 = vpor_avx2(auVar4,auVar8);
  *(undefined1 (*) [32])(in + 2) = auVar8;
  in[10] = uVar1 << 10 | auVar7._28_4_ >> 0xc;
  return in + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask22_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (22 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (22 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (22 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (22 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (22 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  ++in;

  return out;
}